

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::UpperInclusiveBetweenOperator,true,true,true>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  idx_t iVar16;
  long lVar17;
  int64_t ldays;
  long lVar18;
  int64_t lmicros;
  long lVar19;
  long lVar20;
  int64_t lmonths;
  long lVar21;
  
  if (count == 0) {
    iVar16 = 0;
  }
  else {
    psVar1 = result_sel->sel_vector;
    psVar2 = asel->sel_vector;
    psVar3 = bsel->sel_vector;
    psVar4 = csel->sel_vector;
    psVar5 = true_sel->sel_vector;
    psVar6 = false_sel->sel_vector;
    iVar16 = 0;
    lVar15 = 0;
    uVar14 = 0;
    do {
      uVar8 = uVar14;
      if (psVar1 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar1[uVar14];
      }
      uVar9 = uVar14;
      if (psVar2 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar2[uVar14];
      }
      uVar12 = uVar14;
      if (psVar3 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar3[uVar14];
      }
      uVar13 = uVar14;
      if (psVar4 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar4[uVar14];
      }
      lVar11._0_4_ = adata[uVar9].months;
      lVar11._4_4_ = adata[uVar9].days;
      lVar17._0_4_ = bdata[uVar12].months;
      lVar17._4_4_ = bdata[uVar12].days;
      lVar10 = (lVar11 >> 0x20) + adata[uVar9].micros / 86400000000;
      lVar19 = adata[uVar9].micros % 86400000000;
      lVar18 = lVar10 % 0x1e;
      lVar21 = (long)(int)(undefined4)lVar11 + lVar10 / 0x1e;
      lVar20 = (lVar17 >> 0x20) + bdata[uVar12].micros / 86400000000;
      lVar10._0_4_ = cdata[uVar13].months;
      lVar10._4_4_ = cdata[uVar13].days;
      lVar11 = (long)(int)(undefined4)lVar17 + lVar20 / 0x1e;
      if (lVar11 < lVar21) {
LAB_00ebc4e7:
        lVar11 = (lVar10 >> 0x20) + cdata[uVar13].micros / 86400000000;
        lVar17 = lVar11 % 0x1e;
        lVar11 = (long)(int)(undefined4)lVar10 + lVar11 / 0x1e;
        if (lVar11 < lVar21) goto LAB_00ebc56e;
        bVar7 = true;
        if (lVar11 <= lVar21) {
          if (lVar17 < lVar18) goto LAB_00ebc56e;
          bVar7 = lVar19 <= cdata[uVar13].micros % 86400000000 || lVar18 < lVar17;
        }
      }
      else {
        if (lVar11 <= lVar21) {
          lVar20 = lVar20 % 0x1e;
          if ((lVar20 < lVar18) ||
             ((bVar7 = false, lVar20 <= lVar18 && (bdata[uVar12].micros % 86400000000 < lVar19))))
          goto LAB_00ebc4e7;
          goto LAB_00ebc570;
        }
LAB_00ebc56e:
        bVar7 = false;
      }
LAB_00ebc570:
      psVar5[iVar16] = (sel_t)uVar8;
      iVar16 = iVar16 + bVar7;
      psVar6[lVar15] = (sel_t)uVar8;
      lVar15 = lVar15 + (ulong)(bVar7 ^ 1);
      uVar14 = uVar14 + 1;
    } while (count != uVar14);
  }
  return iVar16;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}